

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void relative8_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  cs_detail *pcVar2;
  uint16_t uVar3;
  uint uVar4;
  ushort uVar5;
  long lVar6;
  
  uVar5 = *address;
  uVar3 = uVar5 + 1;
  *address = uVar3;
  lVar6 = (ulong)uVar5 - (ulong)info->offset;
  if ((uint)lVar6 < info->size) {
    bVar1 = info->code[lVar6];
    uVar5 = (ushort)bVar1;
    if ((char)bVar1 < '\0') {
      uVar5 = bVar1 | 0xff00;
    }
  }
  else {
    uVar5 = 0;
  }
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  (info->m680x).operands[bVar1].type = M680X_OP_RELATIVE;
  (info->m680x).operands[bVar1].size = '\0';
  (info->m680x).operands[bVar1].field_1.rel.offset = uVar5;
  (info->m680x).operands[bVar1].field_1.rel.address = uVar3 + uVar5;
  pcVar2 = MI->flat_insn->detail;
  if (pcVar2 != (cs_detail *)0x0) {
    bVar1 = pcVar2->groups_count;
    pcVar2->groups_count = bVar1 + 1;
    pcVar2->groups[bVar1] = '\a';
  }
  uVar4 = info->insn - M680X_INS_BRA;
  if ((uVar4 < 4) && (uVar4 != 2)) {
    return;
  }
  add_reg_to_rw_list(MI,M680X_REG_CC,READ);
  return;
}

Assistant:

static void relative8_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	int16_t offset = 0;

	read_byte_sign_extended(info, &offset, (*address)++);
	add_rel_operand(info, offset, *address + offset);
	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);

	if ((info->insn != M680X_INS_BRA) &&
		(info->insn != M680X_INS_BSR) &&
		(info->insn != M680X_INS_BRN))
		add_reg_to_rw_list(MI, M680X_REG_CC, READ);
}